

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<cv::Mat>>,std::tuple<cv::Mat>>
               (tuple<testing::Matcher<cv::Mat>_> *matchers,tuple<cv::Mat> *values,ostream *os)

{
  MatcherInterface<cv::Mat> *pMVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  linked_ptr<const_testing::MatcherInterface<cv::Mat>_> *ptr;
  undefined1 local_2c0 [8];
  StringMatchResultListener listener;
  Mat local_c8 [8];
  Value value;
  undefined1 local_68 [8];
  type matcher;
  long local_48;
  linked_ptr_internal local_40 [2];
  
  local_68 = (undefined1  [8])&PTR__MatcherBase_00181fd8;
  ptr = &(matchers->super__Tuple_impl<0UL,_testing::Matcher<cv::Mat>_>).
         super__Head_base<0UL,_testing::Matcher<cv::Mat>,_false>._M_head_impl.
         super_MatcherBase<cv::Mat>.impl_;
  linked_ptr<const_testing::MatcherInterface<cv::Mat>_>::linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<cv::Mat>_> *)&matcher,ptr);
  local_68 = (undefined1  [8])&PTR__MatcherBase_00181f90;
  cv::Mat::Mat(local_c8,(Mat *)values);
  listener.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)&listener.field_0x18;
  local_2c0 = (undefined1  [8])&PTR__StringMatchResultListener_001820e0;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&listener.super_MatchResultListener.stream_);
  cv::Mat::Mat((Mat *)&listener.field_0x190,local_c8);
  bVar2 = MatcherBase<cv::Mat>::MatchAndExplain
                    ((MatcherBase<cv::Mat> *)local_68,(Mat *)&listener.field_0x190,
                     (MatchResultListener *)local_2c0);
  cv::Mat::~Mat((Mat *)&listener.field_0x190);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    pMVar1 = ptr->value_;
    (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar1,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    testing_internal::DefaultPrintNonContainerTo<cv::Mat>(local_c8,os);
    std::__cxx11::stringbuf::str();
    iVar3 = std::__cxx11::string::compare((char *)&matcher.super_MatcherBase<cv::Mat>.impl_.link_);
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(char *)matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_,local_48);
    }
    if (matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_ != local_40) {
      operator_delete(matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_,
                      (ulong)((long)&(local_40[0].next_)->next_ + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_2c0 = (undefined1  [8])&PTR__StringMatchResultListener_001820e0;
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)&listener.super_MatchResultListener.stream_);
  std::ios_base::~ios_base((ios_base *)&listener.field_0x88);
  cv::Mat::~Mat(local_c8);
  local_68 = (undefined1  [8])&PTR__MatcherBase_00181fd8;
  linked_ptr<const_testing::MatcherInterface<cv::Mat>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<cv::Mat>_> *)&matcher);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }